

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Entry * __thiscall
kj::
Table<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry,_kj::HashIndex<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>_>
::release(Entry *__return_storage_ptr__,
         Table<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry,_kj::HashIndex<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>_>
         *this,Entry *row)

{
  size_t oldPos;
  Entry *pEVar1;
  uint *puVar2;
  ArrayDisposer *pAVar3;
  bool bVar4;
  size_t sVar5;
  HashIndex<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>
  *indexObj;
  ArrayPtr<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry>
  table;
  ArrayPtr<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry>
  table_00;
  
  pEVar1 = (this->rows).builder.ptr;
  sVar5 = ((long)row - (long)pEVar1 >> 4) * -0x5555555555555555;
  table.size_ = ((long)(this->rows).builder.pos - (long)pEVar1 >> 4) * -0x5555555555555555;
  table.ptr = pEVar1;
  HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>
  ::
  erase<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry,unsigned_int&>
            ((HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>
              *)&this->indexes,table,sVar5,&row->key);
  __return_storage_ptr__->key = row->key;
  (__return_storage_ptr__->value).paramExports.ptr = (row->value).paramExports.ptr;
  (__return_storage_ptr__->value).paramExports.size_ = (row->value).paramExports.size_;
  (__return_storage_ptr__->value).paramExports.disposer = (row->value).paramExports.disposer;
  (row->value).paramExports.ptr = (uint *)0x0;
  (row->value).paramExports.size_ = 0;
  (__return_storage_ptr__->value).selfRef.ptr = (row->value).selfRef.ptr;
  (row->value).selfRef.ptr = (QuestionRef *)0x0;
  (__return_storage_ptr__->value).skipFinish = (row->value).skipFinish;
  bVar4 = (row->value).isTailCall;
  (__return_storage_ptr__->value).isAwaitingReturn = (row->value).isAwaitingReturn;
  (__return_storage_ptr__->value).isTailCall = bVar4;
  pEVar1 = (this->rows).builder.ptr;
  table_00.size_ = ((long)(this->rows).builder.pos - (long)pEVar1 >> 4) * -0x5555555555555555;
  oldPos = table_00.size_ - 1;
  if (sVar5 - oldPos != 0) {
    table_00.ptr = pEVar1;
    HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>
    ::
    move<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry,unsigned_int&>
              ((HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>
                *)&this->indexes,table_00,oldPos,sVar5,&pEVar1[oldPos].key);
    pEVar1 = (this->rows).builder.ptr;
    row->key = pEVar1[oldPos].key;
    puVar2 = (row->value).paramExports.ptr;
    if (puVar2 != (uint *)0x0) {
      sVar5 = (row->value).paramExports.size_;
      (row->value).paramExports.ptr = (uint *)0x0;
      (row->value).paramExports.size_ = 0;
      pAVar3 = (row->value).paramExports.disposer;
      (**pAVar3->_vptr_ArrayDisposer)(pAVar3,puVar2,4,sVar5,sVar5,0);
    }
    (row->value).paramExports.ptr = pEVar1[oldPos].value.paramExports.ptr;
    (row->value).paramExports.size_ = pEVar1[oldPos].value.paramExports.size_;
    (row->value).paramExports.disposer = pEVar1[oldPos].value.paramExports.disposer;
    pEVar1[oldPos].value.paramExports.ptr = (uint *)0x0;
    pEVar1[oldPos].value.paramExports.size_ = 0;
    (row->value).selfRef.ptr = pEVar1[oldPos].value.selfRef.ptr;
    pEVar1[oldPos].value.selfRef.ptr = (QuestionRef *)0x0;
    (row->value).skipFinish = pEVar1[oldPos].value.skipFinish;
    bVar4 = pEVar1[oldPos].value.isTailCall;
    (row->value).isAwaitingReturn = pEVar1[oldPos].value.isAwaitingReturn;
    (row->value).isTailCall = bVar4;
  }
  ArrayBuilder<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry>
  ::removeLast((ArrayBuilder<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry>
                *)this);
  return __return_storage_ptr__;
}

Assistant:

Row Table<Row, Indexes...>::release(Row& row) {
  KJ_TABLE_IREQUIRE(&row >= rows.begin() && &row < rows.end(), "row is not a member of this table");
  size_t pos = &row - rows.begin();
  Impl<>::erase(*this, pos, row);
  Row result = kj::mv(row);
  size_t back = rows.size() - 1;
  if (pos != back) {
    Impl<>::move(*this, back, pos, rows[back]);
    row = kj::mv(rows[back]);
  }
  rows.removeLast();
  return result;
}